

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::construct
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 *intervals_,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *filter,bool erase_below_diagonal,size_t number_of_pixels,double min_,double max_)

{
  ulong uVar1;
  double dVar2;
  pointer ppVar3;
  pointer pvVar4;
  int iVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  undefined7 in_register_00000009;
  long lVar9;
  ulong uVar10;
  long lVar11;
  size_t pt_nr;
  ulong uVar12;
  pointer pvVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  allocator_type local_91;
  size_type local_90;
  pointer local_88;
  undefined4 local_7c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_78;
  value_type_conflict1 local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  heat_map_;
  vector<double,_std::allocator<double>_> v;
  
  local_7c = (undefined4)CONCAT71(in_register_00000009,erase_below_diagonal);
  if ((min_ == max_) && (!NAN(min_) && !NAN(max_))) {
    ppVar3 = (intervals_->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar9 = (long)(intervals_->
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 4;
    pdVar6 = &ppVar3->second;
    dVar16 = 2147483647.0;
    dVar18 = -2147483647.0;
    while (bVar15 = lVar9 != 0, lVar9 = lVar9 + -1, bVar15) {
      dVar2 = ((pair<double,_double> *)(pdVar6 + -1))->first;
      if (dVar16 <= ((pair<double,_double> *)(pdVar6 + -1))->first) {
        dVar2 = dVar16;
      }
      dVar16 = dVar2;
      dVar2 = *pdVar6;
      if (*pdVar6 <= dVar18) {
        dVar2 = dVar18;
      }
      dVar18 = dVar2;
      pdVar6 = pdVar6 + 2;
    }
    min_ = dVar16 - ABS(dVar18 - dVar16) / 100.0;
    max_ = ABS(dVar18 - min_) / 100.0 + dVar18;
  }
  this->min_ = min_;
  this->max_ = max_;
  heat_map_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  heat_map_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  heat_map_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = number_of_pixels;
  local_88 = (pointer)intervals_;
  local_78 = filter;
  while (bVar15 = number_of_pixels != 0, number_of_pixels = number_of_pixels - 1, bVar15) {
    local_70 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &v.super__Vector_base<double,_std::allocator<double>_>,local_90,&local_70,&local_91);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&heat_map_,(value_type *)&v.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&v.super__Vector_base<double,_std::allocator<double>_>);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->heat_map,&heat_map_);
  ppVar3 = (((_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
             )&local_88->first)->_M_impl).super__Vector_impl_data._M_start;
  uVar7 = local_90 >> 0x20;
  uVar17 = (undefined4)local_90;
  local_90 = (long)(((_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      *)&local_88->first)->_M_impl).super__Vector_impl_data._M_finish - (long)ppVar3
             >> 4;
  dVar16 = ((double)CONCAT44(0x45300000,(int)uVar7) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar17) - 4503599627370496.0);
  for (lVar9 = 0; lVar9 != local_90; lVar9 = lVar9 + 1) {
    dVar18 = this->min_;
    dVar2 = ppVar3[lVar9].first;
    dVar19 = this->max_ - dVar18;
    pvVar4 = (local_78->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(local_78->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18;
    iVar5 = (int)(uVar7 >> 1);
    lVar14 = (long)((int)(((ppVar3[lVar9].second - dVar18) / dVar19) * dVar16) - iVar5);
    for (uVar12 = 0; uVar12 != uVar7; uVar12 = uVar12 + 1) {
      uVar1 = (long)((int)(((dVar2 - dVar18) / dVar19) * dVar16) - iVar5) + uVar12;
      pvVar13 = (this->heat_map).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->heat_map).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13) / 0x18;
      pvVar13 = pvVar13 + lVar14;
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        if ((uVar1 < uVar8) && (lVar14 + uVar10 < uVar8)) {
          lVar11 = *(long *)&(pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data;
          *(double *)(lVar11 + uVar1 * 8) =
               *(double *)
                (*(long *)&pvVar4[uVar12].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + uVar10 * 8) +
               *(double *)(lVar11 + uVar1 * 8);
        }
        pvVar13 = pvVar13 + 1;
      }
    }
  }
  if ((char)local_7c != '\0') {
    pvVar4 = (this->heat_map).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = ((long)(this->heat_map).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18;
    for (lVar14 = 0; lVar14 != lVar9; lVar14 = lVar14 + 1) {
      for (lVar11 = lVar14; lVar9 != lVar11; lVar11 = lVar11 + 1) {
        *(undefined8 *)
         (*(long *)&pvVar4[lVar14].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + lVar11 * 8) = 0;
      }
    }
  }
  local_88 = ppVar3;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&heat_map_);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::construct(const std::vector<std::pair<double, double> >& intervals_,
                                                           std::vector<std::vector<double> > filter,
                                                           bool erase_below_diagonal, size_t number_of_pixels,
                                                           double min_, double max_) {
  bool dbg = false;
  if (dbg) std::clog << "Entering construct procedure \n";
  Scalling_of_kernels f;
  this->f = f;

  if (dbg) std::clog << "min and max passed to construct() procedure: " << min_ << " " << max_ << std::endl;

  if (min_ == max_) {
    if (dbg) std::clog << "min and max parameters will be determined based on intervals \n";
    // in this case, we want the program to set up the min_ and max_ values by itself.
    min_ = std::numeric_limits<int>::max();
    max_ = -std::numeric_limits<int>::max();

    for (size_t i = 0; i != intervals_.size(); ++i) {
      if (intervals_[i].first < min_) min_ = intervals_[i].first;
      if (intervals_[i].second > max_) max_ = intervals_[i].second;
    }
    // now we have the structure filled in, and moreover we know min_ and max_ values of the interval, so we know the
    // range.

    // add some more space:
    min_ -= fabs(max_ - min_) / 100;
    max_ += fabs(max_ - min_) / 100;
  }

  if (dbg) {
    std::clog << "min_ : " << min_ << std::endl;
    std::clog << "max_ : " << max_ << std::endl;
    std::clog << "number_of_pixels : " << number_of_pixels << std::endl;
    getchar();
  }

  this->min_ = min_;
  this->max_ = max_;

  // initialization of the structure heat_map
  std::vector<std::vector<double> > heat_map_;
  for (size_t i = 0; i != number_of_pixels; ++i) {
    std::vector<double> v(number_of_pixels, 0);
    heat_map_.push_back(v);
  }
  this->heat_map = heat_map_;

  if (dbg) std::clog << "Done creating of the heat map, now we will fill in the structure \n";

  for (size_t pt_nr = 0; pt_nr != intervals_.size(); ++pt_nr) {
    // compute the value of intervals_[pt_nr] in the grid:
    int x_grid =
        static_cast<int>((intervals_[pt_nr].first - this->min_) / (this->max_ - this->min_) * number_of_pixels);
    int y_grid =
        static_cast<int>((intervals_[pt_nr].second - this->min_) / (this->max_ - this->min_) * number_of_pixels);

    if (dbg) {
      std::clog << "point : " << intervals_[pt_nr].first << " , " << intervals_[pt_nr].second << std::endl;
      std::clog << "x_grid : " << x_grid << std::endl;
      std::clog << "y_grid : " << y_grid << std::endl;
    }

    // x_grid and y_grid gives a center of the kernel. We want to have its lower left corner. To get this, we need to
    // shift x_grid and y_grid by a grid diameter.
    x_grid -= filter.size() / 2;
    y_grid -= filter.size() / 2;
    // note that the numbers x_grid and y_grid may be negative.

    if (dbg) {
      std::clog << "After shift : \n";
      std::clog << "x_grid : " << x_grid << std::endl;
      std::clog << "y_grid : " << y_grid << std::endl;
    }

    double scaling_value = this->f(intervals_[pt_nr]);

    for (size_t i = 0; i != filter.size(); ++i) {
      for (size_t j = 0; j != filter.size(); ++j) {
        // if the point (x_grid+i,y_grid+j) is the correct point in the grid.
        if (((x_grid + i) >= 0) && (x_grid + i < this->heat_map.size()) && ((y_grid + j) >= 0) &&
            (y_grid + j < this->heat_map.size())) {
          if (dbg) {
            std::clog << y_grid + j << " " << x_grid + i << std::endl;
          }
          this->heat_map[y_grid + j][x_grid + i] += scaling_value * filter[i][j];
          if (dbg) {
            std::clog << "Position : (" << x_grid + i << "," << y_grid + j
                      << ") got increased by the value : " << filter[i][j] << std::endl;
          }
        }
      }
    }
  }

  // now it remains to cut everything below diagonal if the user wants us to.
  if (erase_below_diagonal) {
    for (size_t i = 0; i != this->heat_map.size(); ++i) {
      for (size_t j = i; j != this->heat_map.size(); ++j) {
        this->heat_map[i][j] = 0;
      }
    }
  }
}